

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
          (basic_ofstream<char,_std::char_traits<char>_> *this)

{
  basic_ofstream<char,_std::char_traits<char>_> *this_local;
  
  std::ios::ios((ios *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  std::ofstream::ofstream((ofstream *)this);
  (this->super_basic_ofstream<char,_std::char_traits<char>_>).
  super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x2a5878;
  *(undefined8 *)
   &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
    super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 = 0x2a58a0;
  return;
}

Assistant:

basic_ofstream() {}